

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateRangeStaticLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int rank;
  pointer pcVar2;
  bool bVar3;
  Result *_result;
  string local_70;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,0,0);
  bVar3 = Result::good(__return_storage_ptr__);
  if (bVar3) {
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar3 = Result::good(__return_storage_ptr__);
    if (bVar3) {
      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
      if (0 < (layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_) {
        rank = *(int *)((long)((layer->outputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0]
                       + 0x24);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Range","");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"output","");
        checkRank(__return_storage_ptr__,layer,&local_50,1,1,&local_70,rank);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        bVar3 = Result::good(__return_storage_ptr__);
        if (!bVar3) {
          return __return_storage_ptr__;
        }
        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateRangeStaticLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 0, 0));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (layer.outputtensor_size() > 0) {
        int rank = static_cast<int>(layer.outputtensor(0).rank());
        HANDLE_RESULT_AND_RETURN_ON_ERROR(checkRank(layer, "Range", 1, 1, "output", rank));
    }

    return Result();
}